

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59db9::TestXmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalled::
~TestXmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalled
          (TestXmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalled *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, OutputIsCachedUntilReportSummaryIsCalled)
{
    TestDetails const details("", "", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "message");
    reporter.ReportTestFinish(details, 1.0F);
    CHECK(output.str().empty());

    reporter.ReportSummary(1, 1, 1, 1.0f);
    CHECK(!output.str().empty());
}